

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfontstash.h
# Opt level: O0

int glfonsRasterize(FONScontext *ctx,fsuint textId,char *s,uint color)

{
  value_type vVar1;
  undefined4 uVar2;
  float fVar3;
  mapped_type pGVar4;
  char *pcVar5;
  uint uVar6;
  size_type sVar7;
  reference pvVar8;
  FONSstate *pFVar9;
  size_t sVar10;
  mapped_type *ppGVar11;
  float fVar12;
  float local_b4;
  float local_b0;
  float local_ac;
  float local_a8;
  uint local_a4 [2];
  uint codepoint;
  uint utf8state;
  int i_1;
  char *end;
  char *str;
  FONSshapingRes *res;
  float local_78;
  float y;
  float x;
  int index;
  int i;
  float y1;
  float y0;
  float x1;
  float x0;
  float inf;
  mapped_type pGStack_50;
  int oldSize;
  GLFONSstash *stash;
  GLFONSbuffer *pGStack_40;
  int length;
  GLFONSbuffer *buffer;
  GLFONScontext *gl;
  char *pcStack_28;
  uint color_local;
  char *s_local;
  FONScontext *pFStack_18;
  fsuint textId_local;
  FONScontext *ctx_local;
  
  buffer = (GLFONSbuffer *)(ctx->params).userPtr;
  gl._4_4_ = color;
  pcStack_28 = s;
  s_local._4_4_ = textId;
  pFStack_18 = ctx;
  pGStack_40 = glfons__bufferBound((GLFONScontext *)buffer);
  fVar12 = fonsDrawText(pFStack_18,0.0,0.0,pcStack_28,(char *)0x0,'\0');
  stash._4_4_ = (int)fVar12;
  if (((float)stash._4_4_ != -1.0) || (NAN((float)stash._4_4_))) {
    pGStack_50 = (mapped_type)operator_new(0x20);
    sVar7 = std::vector<float,_std::allocator<float>_>::size(&pGStack_40->interleavedArray);
    pGStack_50->offset = sVar7;
    sVar7 = std::vector<float,_std::allocator<float>_>::size(&pGStack_40->interleavedArray);
    inf = (float)sVar7;
    x0 = 0.0;
    std::vector<float,_std::allocator<float>_>::resize
              (&pGStack_40->interleavedArray,
               (long)(int)inf + *(long *)buffer * (long)pFStack_18->nverts,&x0);
    i = (int)std::numeric_limits<float>::infinity();
    y1 = -(float)i;
    index = (int)-(float)i;
    y = inf;
    y0 = (float)i;
    x1 = (float)i;
    for (x = 0.0; SBORROW4((int)x,pFStack_18->nverts * 2) != (int)x + pFStack_18->nverts * -2 < 0;
        x = (float)((int)x + 2)) {
      fVar12 = pFStack_18->verts[(int)x];
      res._4_4_ = pFStack_18->verts[(int)x + 1];
      local_a8 = fVar12;
      if (y0 <= fVar12) {
        local_a8 = y0;
      }
      y0 = local_a8;
      local_ac = fVar12;
      if (fVar12 <= y1) {
        local_ac = y1;
      }
      y1 = local_ac;
      local_b0 = res._4_4_;
      if ((float)i <= res._4_4_) {
        local_b0 = (float)i;
      }
      i = (int)local_b0;
      local_b4 = res._4_4_;
      if (res._4_4_ <= (float)index) {
        local_b4 = (float)index;
      }
      index = (int)local_b4;
      sVar7 = (size_type)(int)y;
      local_78 = fVar12;
      y = (float)((int)y + 1);
      pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&pGStack_40->interleavedArray,sVar7);
      fVar3 = res._4_4_;
      *pvVar8 = fVar12;
      sVar7 = (size_type)(int)y;
      y = (float)((int)y + 1);
      pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&pGStack_40->interleavedArray,sVar7);
      *pvVar8 = fVar3;
      vVar1 = pFStack_18->tcoords[(int)x];
      sVar7 = (size_type)(int)y;
      y = (float)((int)y + 1);
      pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&pGStack_40->interleavedArray,sVar7);
      *pvVar8 = vVar1;
      vVar1 = pFStack_18->tcoords[(int)x + 1];
      sVar7 = (size_type)(int)y;
      y = (float)((int)y + 1);
      pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&pGStack_40->interleavedArray,sVar7);
      *pvVar8 = vVar1;
      y = (float)((int)y + 4);
    }
    pGStack_50->bbox[0] = y0 + 3.0;
    pGStack_50->bbox[1] = (float)i - 3.0;
    pGStack_50->bbox[2] = y1 + 3.0;
    pGStack_50->bbox[3] = (float)index - 3.0;
    pGStack_50->length = (float)(stash._4_4_ + -6);
    if ((pFStack_18->shaping == (FONSshaping *)0x0) ||
       (pFVar9 = fons__getState(pFStack_18), pFVar9->useShaping == 0)) {
      pcVar5 = pcStack_28;
      end = pcStack_28;
      sVar10 = strlen(pcStack_28);
      _utf8state = pcVar5 + sVar10;
      codepoint = 0;
      local_a4[1] = 0;
      local_a4[0] = 0;
      for (; end != _utf8state; end = end + 1) {
        uVar6 = fons__decutf8(local_a4 + 1,local_a4,(uint)(byte)*end);
        if (uVar6 == 0) {
          codepoint = codepoint + 1;
        }
      }
      pGStack_50->nbGlyph = (short)codepoint;
    }
    else {
      str = (char *)pFStack_18->shaping->result;
      pGStack_50->nbGlyph = (short)((FONSshapingRes *)str)->glyphCount;
      fons__clearShaping(pFStack_18);
    }
    pGVar4 = pGStack_50;
    uVar2 = buffer->id;
    pGStack_50->padding = pGStack_50->nbGlyph * 6 * (short)uVar2;
    pGStack_40->nVerts = pFStack_18->nverts + pGStack_40->nVerts;
    pFStack_18->nverts = 0;
    ppGVar11 = std::
               unordered_map<unsigned_int,_GLFONSstash_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GLFONSstash_*>_>_>
               ::operator[](&pGStack_40->stashes,(key_type *)((long)&s_local + 4));
    *ppGVar11 = pGVar4;
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

int glfonsRasterize(FONScontext* ctx, fsuint textId, const char* s, unsigned int color) {
    (void) color;
    GLFONScontext* gl = (GLFONScontext*) ctx->params.userPtr;
    GLFONSbuffer* buffer = glfons__bufferBound(gl);

    int length = fonsDrawText(ctx, 0, 0, s, NULL, 0);

    if (length == -1.f) {
        return GLFONS_INVALID;
    }

    GLFONSstash* stash = new GLFONSstash;

    stash->offset = buffer->interleavedArray.size();

    // pre-allocate data for this text id
    int oldSize = buffer->interleavedArray.size();
    buffer->interleavedArray.resize(oldSize + gl->layout.nbComponents * ctx->nverts, 0);

    float inf = std::numeric_limits<float>::infinity();
    float x0 = inf, x1 = -inf, y0 = inf, y1 = -inf;

    for(int i = 0, index = oldSize; i < ctx->nverts * 2; i += 2) {
        float x, y;

        x = ctx->verts[i];
        y = ctx->verts[i + 1];

        x0 = x < x0 ? x : x0;
        x1 = x > x1 ? x : x1;
        y0 = y < y0 ? y : y0;
        y1 = y > y1 ? y : y1;

        buffer->interleavedArray[index++] = x;
        buffer->interleavedArray[index++] = y;
        buffer->interleavedArray[index++] = ctx->tcoords[i];
        buffer->interleavedArray[index++] = ctx->tcoords[i + 1];
        index += 4; // skip screenPos / alpha / rotation
    }

    // remove extra-offset used for interpolation in fontstash
    stash->bbox[0] = x0 + 3;
    stash->bbox[1] = y0 - 3;
    stash->bbox[2] = x1 + 3;
    stash->bbox[3] = y1 - 3;

    stash->length = length - 6;

    if(ctx->shaping != NULL && fons__getState(ctx)->useShaping) {
        FONSshapingRes* res = ctx->shaping->result;
        stash->nbGlyph = res->glyphCount;
        fons__clearShaping(ctx);
    } else {
        const char* str = s;
        const char* end = s + strlen(s);
        int i = 0;
        unsigned int utf8state = 0;
        unsigned int codepoint = 0;

        // count glyphs
        for (; str != end; ++str) {
            if (fons__decutf8(&utf8state, &codepoint, *(const unsigned char*)str))
                continue;
            i++;
        }
        stash->nbGlyph = i;
    }

    stash->padding = stash->nbGlyph * GLYPH_VERTS * gl->layout.nbComponents;

    // hack : reset fontstash state
    buffer->nVerts += ctx->nverts;
    ctx->nverts = 0;

    buffer->stashes[textId] = stash;

    return GLFONS_VALID;
}